

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams.cpp
# Opt level: O0

ssize_t __thiscall AutoFile::read(AutoFile *this,int __fd,void *__buf,size_t __nbytes)

{
  uint uVar1;
  size_t sVar2;
  size_t sVar3;
  char *pcVar4;
  char *pcVar5;
  undefined4 in_register_00000034;
  FILE *__stream;
  long in_FS_OFFSET;
  undefined1 in_stack_00000030 [16];
  Span<std::byte> *in_stack_ffffffffffffff78;
  error_code local_38;
  FILE *local_28;
  void *local_20;
  FILE *local_18;
  void *local_10;
  AutoFile *this_00;
  
  __stream = (FILE *)CONCAT44(in_register_00000034,__fd);
  this_00 = *(AutoFile **)(in_FS_OFFSET + 0x28);
  local_28 = __stream;
  local_20 = __buf;
  local_18 = __stream;
  local_10 = __buf;
  sVar2 = detail_fread(this_00,(Span<std::byte>)in_stack_00000030);
  sVar3 = Span<std::byte>::size(in_stack_ffffffffffffff78);
  if (sVar2 == sVar3) {
    if (*(AutoFile **)(in_FS_OFFSET + 0x28) == this_00) {
      return (ssize_t)*(AutoFile **)(in_FS_OFFSET + 0x28);
    }
  }
  else {
    pcVar4 = (char *)__cxa_allocate_exception(0x20);
    uVar1 = feof(this,__stream);
    pcVar5 = "AutoFile::read: fread failed";
    if ((uVar1 & 1) != 0) {
      pcVar5 = "AutoFile::read: end of file";
    }
    std::error_code::error_code<std::io_errc,void>(&local_38,0);
    std::ios_base::failure[abi:cxx11]::failure(pcVar4,(error_code *)pcVar5);
    if (*(AutoFile **)(in_FS_OFFSET + 0x28) == this_00) {
      __cxa_throw(pcVar4,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
  }
  __stack_chk_fail();
}

Assistant:

void AutoFile::read(Span<std::byte> dst)
{
    if (detail_fread(dst) != dst.size()) {
        throw std::ios_base::failure(feof() ? "AutoFile::read: end of file" : "AutoFile::read: fread failed");
    }
}